

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

void __thiscall HighsBasis::invalidate(HighsBasis *this)

{
  this->valid = false;
  this->alien = true;
  this->useful = false;
  this->was_alien = true;
  this->debug_id = -1;
  this->debug_update_count = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&this->debug_origin_name,0,(char *)(this->debug_origin_name)._M_string_length,
             0x3be9c6);
  return;
}

Assistant:

void HighsBasis::invalidate() {
  this->valid = false;
  this->alien = true;
  this->useful = false;
  this->was_alien = true;
  this->debug_id = -1;
  this->debug_update_count = -1;
  this->debug_origin_name = "None";
}